

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioFunc.c
# Opt level: O3

int Mio_GateCollectNames(char *pFormula,char **pPinNames)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  byte *__dest;
  char *__s1;
  char *__dest_00;
  long lVar4;
  ulong uVar5;
  byte *__s;
  uint uVar6;
  
  if (pFormula == (char *)0x0) {
    __dest = (byte *)0x0;
    __s = __dest;
  }
  else {
    sVar3 = strlen(pFormula);
    __dest = (byte *)malloc(sVar3 + 1);
    strcpy((char *)__dest,pFormula);
    __s = __dest;
  }
  do {
    bVar1 = *__dest;
    if (bVar1 < 0x5e) {
      if ((bVar1 - 0x26 < 6) || (bVar1 == 0x21)) {
LAB_008b6229:
        *__dest = 0x20;
      }
      else if (bVar1 == 0) break;
    }
    else if ((bVar1 == 0x7c) || (bVar1 == 0x5e)) goto LAB_008b6229;
    __dest = __dest + 1;
  } while( true );
  __s1 = strtok((char *)__s," ");
  if (__s1 == (char *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar5 = 0;
      if ((int)uVar6 < 1) {
LAB_008b6294:
        if ((uint)uVar5 == uVar6) goto LAB_008b6299;
      }
      else {
        uVar5 = 0;
        do {
          iVar2 = strcmp(__s1,pPinNames[uVar5]);
          if (iVar2 == 0) goto LAB_008b6294;
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
LAB_008b6299:
        sVar3 = strlen(__s1);
        __dest_00 = (char *)malloc(sVar3 + 1);
        strcpy(__dest_00,__s1);
        lVar4 = (long)(int)uVar6;
        uVar6 = uVar6 + 1;
        pPinNames[lVar4] = __dest_00;
      }
      __s1 = strtok((char *)0x0," ");
    } while (__s1 != (char *)0x0);
  }
  if (__s != (byte *)0x0) {
    free(__s);
  }
  return uVar6;
}

Assistant:

int Mio_GateCollectNames( char * pFormula, char * pPinNames[] )
{
    char * Buffer;
    char * pTemp;
    int nPins, i;

    // save the formula as it was
    //strcpy( Buffer, pFormula );
    Buffer = Abc_UtilStrsav( pFormula );

    // remove the non-name symbols
    for ( pTemp = Buffer; *pTemp; pTemp++ )
        if ( *pTemp == MIO_SYMB_AND  || *pTemp == MIO_SYMB_AND2   || 
             *pTemp == MIO_SYMB_OR   || *pTemp == MIO_SYMB_OR2    || 
             *pTemp == MIO_SYMB_XOR  || 
             *pTemp == MIO_SYMB_NOT  || *pTemp == MIO_SYMB_AFTNOT ||
             *pTemp == MIO_SYMB_OPEN || *pTemp == MIO_SYMB_CLOSE )
             *pTemp = ' ';

    // save the names
    nPins = 0;
    pTemp = strtok( Buffer, " " );
    while ( pTemp )
    {
        for ( i = 0; i < nPins; i++ )
            if ( strcmp( pTemp, pPinNames[i] ) == 0 )
                break;
        if ( i == nPins )
        { // cannot find this name; save it
            pPinNames[nPins++] = Abc_UtilStrsav(pTemp);
        }
        // get the next name
        pTemp = strtok( NULL, " " );
    }
    ABC_FREE( Buffer );
    return nPins;
}